

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DP.c
# Opt level: O0

logical patch_intersect(Integer ilo,Integer ihi,Integer jlo,Integer jhi,Integer *ilop,Integer *ihip,
                       Integer *jlop,Integer *jhip)

{
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  Integer *ihip_local;
  Integer *ilop_local;
  Integer jhi_local;
  Integer jlo_local;
  Integer ihi_local;
  Integer ilo_local;
  undefined8 local_8;
  
  if ((ihi < ilo) || (jhi < jlo)) {
    local_8 = 0;
  }
  else if ((*ihip < *ilop) || (*jhip < *jlop)) {
    local_8 = 0;
  }
  else if ((ihi < *ilop) || (*ihip < ilo)) {
    local_8 = 0;
  }
  else if ((jhi < *jlop) || (*jhip < jlo)) {
    local_8 = 0;
  }
  else {
    local_40 = ilo;
    if (ilo < *ilop) {
      local_40 = *ilop;
    }
    *ilop = local_40;
    local_48 = ihi;
    if (*ihip < ihi) {
      local_48 = *ihip;
    }
    *ihip = local_48;
    local_50 = jlo;
    if (jlo < *jlop) {
      local_50 = *jlop;
    }
    *jlop = local_50;
    local_58 = jhi;
    if (*jhip < jhi) {
      local_58 = *jhip;
    }
    *jhip = local_58;
    local_8 = 1;
  }
  return local_8;
}

Assistant:

static logical patch_intersect(ilo, ihi, jlo, jhi, ilop, ihip, jlop, jhip)
     Integer ilo, ihi, jlo, jhi;
     Integer *ilop, *ihip, *jlop, *jhip;
{
     /* check consistency of patch coordinates */
     if( ihi < ilo || jhi < jlo)     return FALSE; /* inconsistent */
     if( *ihip < *ilop || *jhip < *jlop) return FALSE; /* inconsistent */

     /* find the intersection and update (ilop: ihip, jlop: jhip) */
     if( ihi < *ilop || *ihip < ilo) return FALSE; /* don't intersect */
     if( jhi < *jlop || *jhip < jlo) return FALSE; /* don't intersect */
     *ilop = GA_MAX(ilo,*ilop);
     *ihip = GA_MIN(ihi,*ihip);
     *jlop = GA_MAX(jlo,*jlop);
     *jhip = GA_MIN(jhi,*jhip);

     return TRUE;
}